

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

int linenoiseHistorySetMaxLen(int len)

{
  int iVar1;
  char **__s;
  int local_20;
  int local_1c;
  int j;
  int tocopy;
  char **new;
  int len_local;
  
  iVar1 = history_len;
  if (len < 1) {
    new._4_4_ = 0;
  }
  else {
    if (history != (char **)0x0) {
      local_1c = history_len;
      __s = (char **)malloc((long)len << 3);
      if (__s == (char **)0x0) {
        return 0;
      }
      if (len < iVar1) {
        for (local_20 = 0; local_1c = len, local_20 < iVar1 - len; local_20 = local_20 + 1) {
          free(history[local_20]);
        }
      }
      memset(__s,0,(long)len << 3);
      memcpy(__s,history + (history_len - local_1c),(long)local_1c << 3);
      free(history);
      history = __s;
    }
    if (len < history_len) {
      history_len = len;
    }
    new._4_4_ = 1;
    history_max_len = len;
  }
  return new._4_4_;
}

Assistant:

int linenoiseHistorySetMaxLen(int len) {
    char **new;

    if (len < 1) return 0;
    if (history) {
        int tocopy = history_len;

        new = malloc(sizeof(char*)*len);
        if (new == NULL) return 0;

        /* If we can't copy everything, free the elements we'll not use. */
        if (len < tocopy) {
            int j;

            for (j = 0; j < tocopy-len; j++) free(history[j]);
            tocopy = len;
        }
        memset(new,0,sizeof(char*)*len);
        memcpy(new,history+(history_len-tocopy), sizeof(char*)*tocopy);
        free(history);
        history = new;
    }
    history_max_len = len;
    if (history_len > history_max_len)
        history_len = history_max_len;
    return 1;
}